

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

YieldResult * __thiscall
NEST::NESTcalc::YieldResultValidity
          (YieldResult *__return_storage_ptr__,NESTcalc *this,YieldResult *res,double energy,
          double Wq_eV)

{
  bool bVar1;
  double *pdVar2;
  double local_38;
  double local_30;
  double local_28;
  double Wq_eV_local;
  double energy_local;
  YieldResult *res_local;
  NESTcalc *this_local;
  
  bVar1 = false;
  if ((res->ElectronYield != -999.0) || (NAN(res->ElectronYield))) {
    bVar1 = false;
    if ((res->PhotonYield != -999.0) || (NAN(res->PhotonYield))) {
      bVar1 = res->ExcitonRatio != -999.0;
    }
  }
  local_28 = Wq_eV;
  Wq_eV_local = energy;
  energy_local = (double)res;
  res_local = (YieldResult *)this;
  if (bVar1) {
    if (energy / 0.0085 < res->PhotonYield) {
      res->PhotonYield = energy / 0.0085;
    }
    if (energy / 0.0085 < res->ElectronYield) {
      res->ElectronYield = energy / 0.0085;
    }
    if (res->PhotonYield <= 0.0 && res->PhotonYield != 0.0) {
      res->PhotonYield = 0.0;
    }
    if (res->ElectronYield <= 0.0 && res->ElectronYield != 0.0) {
      res->ElectronYield = 0.0;
    }
    local_30 = 0.0;
    local_38 = 1.0;
    pdVar2 = std::min<double>(&res->Lindhard,&local_38);
    pdVar2 = std::max<double>(&local_30,pdVar2);
    *(double *)((long)energy_local + 0x18) = *pdVar2;
    if (Wq_eV_local < (local_28 * 0.001) / *(double *)((long)energy_local + 0x18)) {
      *(undefined8 *)energy_local = 0;
      *(undefined8 *)((long)energy_local + 8) = 0;
    }
    memcpy(__return_storage_ptr__,(void *)energy_local,0x30);
    return __return_storage_ptr__;
  }
  __assert_fail("res.ElectronYield != -999 && res.PhotonYield != -999 && res.ExcitonRatio != -999",
                "/workspace/llm4binary/github/license_c_cmakelists/NESTCollaboration[P]nest/src/NEST.cpp"
                ,0x47a,
                "virtual YieldResult NEST::NESTcalc::YieldResultValidity(YieldResult &, const double, const double)"
               );
}

Assistant:

YieldResult NESTcalc::YieldResultValidity(YieldResult &res, const double energy,
                                          const double Wq_eV) {
  assert(res.ElectronYield != -999 && res.PhotonYield != -999 &&
         res.ExcitonRatio != -999);
  if (res.PhotonYield > energy / W_SCINT)
    res.PhotonYield =
        energy / W_SCINT;  // yields can never exceed 1 / [ W ~ few eV ]
  if (res.ElectronYield > energy / W_SCINT)
    res.ElectronYield = energy / W_SCINT;
  if (res.PhotonYield < 0.) res.PhotonYield = 0.;
  if (res.ElectronYield < 0.) res.ElectronYield = 0.;
  res.Lindhard = max(0., min(res.Lindhard, 1.));  // Lindhard Factor
  if (energy < 0.001 * Wq_eV / res.Lindhard) {
    res.PhotonYield = 0.;
    res.ElectronYield = 0.;
  }
  return res;
}